

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

BOOL __thiscall
Js::CustomExternalWrapperObject::SetPropertyTrap
          (CustomExternalWrapperObject *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          JavascriptString *propertyNameString,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,PropertyValueInfo *info)

{
  ScriptContext *scriptContext;
  Type *pTVar1;
  code *pcVar2;
  ThreadContext *this_00;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  JavascriptFunction *function;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  RecyclableObject *ptr;
  Var pvVar7;
  long local_80;
  PropertyRecord *propertyRecord;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  ThreadContext *local_60;
  Var local_58;
  PropertyRecord *local_50;
  Var local_48;
  PropertyValueInfo *local_40;
  ImplicitCallFlags local_31;
  
  local_40 = info;
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  local_48 = newValue;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_60 = requestContext->threadContext;
  propertyNameNumericValue = requestContext;
  BVar4 = EnsureInitialized(this,requestContext);
  if (BVar4 == 0) {
    return 0;
  }
  pTVar1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar7 = *(Var *)&(pTVar1[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar7 == (Var)0x0) {
    pvVar7 = CrossSite::MarshalVar
                       ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                        scriptContext.ptr,local_48,false);
    BVar4 = DynamicObject::SetProperty
                      (&this->super_DynamicObject,propertyNameString,pvVar7,propertyOperationFlags,
                       (PropertyValueInfo *)0x0);
    return BVar4;
  }
  function = VarTo<Js::JavascriptFunction>(pvVar7);
  bVar3 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(propertyNameString,&local_80,0)
  ;
  local_58 = GetName((CustomExternalWrapperObject *)propertyNameString,
                     (ScriptContext *)propertyNameNumericValue,*(PropertyId *)(local_80 + 8),
                     &propertyRecord,&isPropertyNameNumeric);
  this_00 = local_60;
  if (local_40 != (PropertyValueInfo *)0x0) {
    local_40->m_instance = (RecyclableObject *)this;
    local_40->m_propertyIndex = 0xffff;
    local_40->m_attributes = '\0';
    local_40->flags = InlineCacheNoFlags;
    *(undefined1 *)&local_40->cacheInfoFlag =
         (char)local_40->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  if (function == (JavascriptFunction *)0x0) {
    return 0;
  }
  local_50 = propertyRecord;
  local_40 = (PropertyValueInfo *)CONCAT71(local_40._1_7_,local_60->reentrancySafeOrHandled);
  local_60->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var6);
    p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var6)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,this
                    ,local_58,local_50,isPropertyNameNumeric,local_48);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
      goto LAB_00b31b00;
    }
    if ((attributes & HasNoSideEffect) == None) {
      local_31 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var6);
      p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var6)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,
                      this,local_58,local_50,isPropertyNameNumeric,local_48);
      this_00->implicitCallFlags = local_31 | ImplicitCall_Accessor;
      goto LAB_00b31b00;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var6);
    p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var6)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,this
                    ,local_58,local_50,isPropertyNameNumeric,local_48);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar3 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00b31b00:
  this_00->reentrancySafeOrHandled = local_40._0_1_;
  BVar4 = JavascriptConversion::ToBoolean(ptr,(ScriptContext *)propertyNameNumericValue);
  return BVar4;
}

Assistant:

BOOL CustomExternalWrapperObject::SetPropertyTrap(Js::Var receiver, SetPropertyTrapKind setPropertyTrapKind, Js::JavascriptString * propertyNameString, Js::Var newValue, Js::ScriptContext * requestContext, Js::PropertyOperationFlags propertyOperationFlags, Js::PropertyValueInfo* info)
{
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        const Js::PropertyRecord* propertyRecord;
        propertyNameString->GetPropertyRecord(&propertyRecord);
        return GetName(requestContext, propertyRecord->GetPropertyId(), isPropertyNameNumeric, propertyNameNumericValue);
    };
    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        newValue = Js::CrossSite::MarshalVar(this->GetScriptContext(), newValue);
        return DynamicObject::SetProperty(propertyNameString, newValue, propertyOperationFlags, nullptr);
    };
    return SetPropertyTrap(receiver, setPropertyTrapKind, getPropertyName, newValue, requestContext, propertyOperationFlags, FALSE, fn, info);
}